

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
::iterator::operator++(iterator *this)

{
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  last;
  byte bVar1;
  code_point cVar2;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if (((this->next_chars_).size_ == (uint)bVar1) &&
     (last._M_current = (this->last_)._M_current, (this->first_)._M_current != last._M_current)) {
    cVar2 = utf_traits<char16_t,2>::
            decode<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                      (&this->first_,last);
    this->next_chars_ = (encoded_chars<char32_t>)((ulong)(uint)cVar2 | 0x100000000);
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }